

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<google::protobuf::json_internal::ResolverPool::Field_const*&&>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<int_&&> *args_1,
          tuple<const_google::protobuf::json_internal::ResolverPool::Field_*&&> *args_2)

{
  Field **ppFVar1;
  bool bVar2;
  reference key;
  iterator local_48;
  iterator local_38;
  iterator local_20;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  ppFVar1 = (args_2->
            super__Tuple_impl<0UL,_const_google::protobuf::json_internal::ResolverPool::Field_*&&>).
            super__Head_base<0UL,_const_google::protobuf::json_internal::ResolverPool::Field_*&&,_false>
            ._M_head_impl;
  *(int *)local_38.field_1.slot_ =
       *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>._M_head_impl;
  *(Field **)((long)local_38.field_1.slot_ + 8) = *ppFVar1;
  key = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
        ::iterator::operator*(&local_38);
  local_20 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
             ::find<int>((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
                          *)this,&key->first);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar2 = container_internal::operator==(&local_20,&local_48);
  if (bVar2) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>, Args = <const std::piecewise_construct_t &, std::tuple<int &&>, std::tuple<const google::protobuf::json_internal::ResolverPool::Field *&&>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }